

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O3

void ncnn::linear_coeffs(int w,int outw,int *xofs,float *alpha)

{
  float __x;
  int iVar1;
  ulong uVar2;
  float fVar3;
  float fVar4;
  
  if (0 < outw) {
    uVar2 = 0;
    do {
      __x = ((float)(int)uVar2 + 0.5) * (float)w * (1.0 / (float)outw) + -0.5;
      fVar3 = floorf(__x);
      iVar1 = (int)fVar3;
      fVar4 = 0.0;
      if (-1 < iVar1) {
        fVar4 = __x - (float)(int)fVar3;
      }
      if (iVar1 < 1) {
        iVar1 = 0;
      }
      if (w + -1 <= iVar1) {
        fVar4 = 1.0;
        iVar1 = w + -2;
      }
      xofs[uVar2] = iVar1;
      alpha[uVar2 * 2] = 1.0 - fVar4;
      alpha[uVar2 * 2 + 1] = fVar4;
      uVar2 = uVar2 + 1;
    } while ((uint)outw != uVar2);
  }
  return;
}

Assistant:

static void linear_coeffs(int w, int outw, int* xofs, float* alpha)
{
    double scale = (double)w / outw;

    for (int dx = 0; dx < outw; dx++)
    {
        float fx = (float)((dx + 0.5) * scale - 0.5);
        int sx = floor(fx);
        fx -= sx;

        if (sx < 0)
        {
            sx = 0;
            fx = 0.f;
        }
        if (sx >= w - 1)
        {
            sx = w - 2;
            fx = 1.f;
        }

        xofs[dx] = sx;

        alpha[dx*2    ] = 1.f - fx;
        alpha[dx*2 + 1] = fx;
    }
}